

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall
cmake::SetWarningFromPreset(cmake *this,string *name,optional<bool> *warning,optional<bool> *error)

{
  DiagLevel DVar1;
  bool bVar2;
  bool *pbVar3;
  mapped_type *pmVar4;
  DiagLevel *pDVar5;
  DiagLevel local_30 [2];
  optional *local_28;
  optional<bool> *error_local;
  optional<bool> *warning_local;
  string *name_local;
  cmake *this_local;
  
  local_28 = (optional *)error;
  error_local = warning;
  warning_local = (optional<bool> *)name;
  name_local = (string *)this;
  bVar2 = std::optional::operator_cast_to_bool((optional *)warning);
  if (bVar2) {
    pbVar3 = std::optional<bool>::operator*(error_local);
    if ((*pbVar3 & 1U) == 0) {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
               ::operator[](&this->DiagLevels,(key_type *)warning_local);
      *pmVar4 = DIAG_IGNORE;
    }
    else {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
               ::operator[](&this->DiagLevels,(key_type *)warning_local);
      local_30[1] = 1;
      pDVar5 = std::max<cmake::DiagLevel>(pmVar4,local_30 + 1);
      DVar1 = *pDVar5;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
               ::operator[](&this->DiagLevels,(key_type *)warning_local);
      *pmVar4 = DVar1;
    }
  }
  bVar2 = std::optional::operator_cast_to_bool(local_28);
  if (bVar2) {
    pbVar3 = std::optional<bool>::operator*((optional<bool> *)local_28);
    if ((*pbVar3 & 1U) == 0) {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
               ::operator[](&this->DiagLevels,(key_type *)warning_local);
      local_30[0] = DIAG_WARN;
      pDVar5 = std::min<cmake::DiagLevel>(pmVar4,local_30);
      DVar1 = *pDVar5;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
               ::operator[](&this->DiagLevels,(key_type *)warning_local);
      *pmVar4 = DVar1;
    }
    else {
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmake::DiagLevel>_>_>
               ::operator[](&this->DiagLevels,(key_type *)warning_local);
      *pmVar4 = DIAG_ERROR;
    }
  }
  return;
}

Assistant:

void cmake::SetWarningFromPreset(const std::string& name,
                                 const cm::optional<bool>& warning,
                                 const cm::optional<bool>& error)
{
  if (warning) {
    if (*warning) {
      this->DiagLevels[name] = std::max(this->DiagLevels[name], DIAG_WARN);
    } else {
      this->DiagLevels[name] = DIAG_IGNORE;
    }
  }
  if (error) {
    if (*error) {
      this->DiagLevels[name] = DIAG_ERROR;
    } else {
      this->DiagLevels[name] = std::min(this->DiagLevels[name], DIAG_WARN);
    }
  }
}